

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_process_function_async
          (t_netstd_generator *this,ostream *out,t_service *tservice,t_function *tfunction)

{
  string *__lhs;
  _Rb_tree_header *p_Var1;
  int *piVar2;
  t_struct *tstruct;
  t_struct *tstruct_00;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  iterator iVar6;
  char *__rhs;
  pointer pptVar7;
  string tmpex;
  string local_2c0;
  string tmpvar;
  string local_268;
  string local_248;
  string tmpResult;
  string resultname;
  string argsname;
  string args;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  t_generator::indent_abi_cxx11_(&argsname,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&argsname);
  poVar5 = std::operator<<(poVar5,"public async global::System.Threading.Tasks.Task ");
  __lhs = &tfunction->name_;
  poVar5 = std::operator<<(poVar5,(string *)__lhs);
  poVar5 = std::operator<<(poVar5,
                           "_ProcessAsync(int seqid, TProtocol iprot, TProtocol oprot, CancellationToken "
                          );
  poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,")");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&resultname,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&resultname);
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&resultname);
  std::__cxx11::string::~string((string *)&argsname);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  std::operator+(&argsname,__lhs,"_args");
  std::operator+(&resultname,__lhs,"_result");
  std::__cxx11::string::string((string *)&local_70,"tmp",(allocator *)&tmpResult);
  t_generator::tmp(&args,(t_generator *)this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  t_generator::indent_abi_cxx11_(&tmpResult,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&tmpResult);
  poVar5 = std::operator<<(poVar5,"var ");
  poVar5 = std::operator<<(poVar5,(string *)&args);
  poVar5 = std::operator<<(poVar5," = new InternalStructs.");
  poVar5 = std::operator<<(poVar5,(string *)&argsname);
  poVar5 = std::operator<<(poVar5,"();");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&tmpex,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&tmpex);
  poVar5 = std::operator<<(poVar5,"await ");
  poVar5 = std::operator<<(poVar5,(string *)&args);
  poVar5 = std::operator<<(poVar5,".ReadAsync(iprot, ");
  poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,");");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&tmpvar);
  poVar5 = std::operator<<(poVar5,"await iprot.ReadMessageEndAsync(");
  poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,");");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  std::__cxx11::string::~string((string *)&tmpex);
  std::__cxx11::string::~string((string *)&tmpResult);
  std::__cxx11::string::string((string *)&local_90,"tmp",(allocator *)&tmpex);
  t_generator::tmp(&tmpResult,(t_generator *)this,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (tfunction->oneway_ == false) {
    t_generator::indent_abi_cxx11_(&tmpex,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&tmpex);
    poVar5 = std::operator<<(poVar5,"var ");
    poVar5 = std::operator<<(poVar5,(string *)&tmpResult);
    poVar5 = std::operator<<(poVar5," = new InternalStructs.");
    poVar5 = std::operator<<(poVar5,(string *)&resultname);
    poVar5 = std::operator<<(poVar5,"();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&tmpex);
  }
  t_generator::indent_abi_cxx11_(&tmpex,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&tmpex);
  poVar5 = std::operator<<(poVar5,"try");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&tmpvar);
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&tmpvar);
  std::__cxx11::string::~string((string *)&tmpex);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  tstruct = tfunction->xceptions_;
  if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    t_generator::indent_abi_cxx11_(&tmpex,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&tmpex);
    poVar5 = std::operator<<(poVar5,"try");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&tmpvar);
    poVar5 = std::operator<<(poVar5,"{");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&tmpvar);
    std::__cxx11::string::~string((string *)&tmpex);
    piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar2 = *piVar2 + 1;
  }
  tstruct_00 = tfunction->arglist_;
  std::__cxx11::string::string((string *)&tmpex,"deprecated",(allocator *)&tmpvar);
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(tfunction->annotations_)._M_t,&tmpex);
  p_Var1 = &(tfunction->annotations_)._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::~string((string *)&tmpex);
  if (p_Var1 != (_Rb_tree_header *)iVar6._M_node) {
    t_generator::indent_abi_cxx11_(&tmpex,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&tmpex);
    poVar5 = std::operator<<(poVar5,"#pragma warning disable CS0618,CS0612");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&tmpex);
  }
  t_generator::indent_abi_cxx11_(&tmpex,(t_generator *)this);
  std::operator<<(out,(string *)&tmpex);
  std::__cxx11::string::~string((string *)&tmpex);
  if (tfunction->oneway_ == false) {
    iVar4 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar4 == '\0') {
      poVar5 = std::operator<<(out,(string *)&tmpResult);
      std::operator<<(poVar5,".Success = ");
    }
  }
  poVar5 = std::operator<<(out,"await _iAsync.");
  std::__cxx11::string::string((string *)&local_d0,(string *)__lhs);
  normalize_name(&tmpvar,this,&local_d0,false);
  __rhs = "";
  if (this->add_async_postfix != false) {
    __rhs = "Async";
  }
  std::operator+(&local_b0,&tmpvar,__rhs);
  func_name(&tmpex,this,&local_b0,false);
  poVar5 = std::operator<<(poVar5,(string *)&tmpex);
  std::operator<<(poVar5,"(");
  std::__cxx11::string::~string((string *)&tmpex);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&tmpvar);
  std::__cxx11::string::~string((string *)&local_d0);
  collect_extensions_types(this,tstruct_00);
  prepare_member_name_mapping(this,tstruct_00);
  bVar3 = true;
  for (pptVar7 = (tstruct_00->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar7 !=
      (tstruct_00->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
    if (bVar3) {
      bVar3 = false;
    }
    else {
      std::operator<<(out,", ");
    }
    poVar5 = std::operator<<(out,(string *)&args);
    poVar5 = std::operator<<(poVar5,".");
    prop_name_abi_cxx11_(&tmpex,this,*pptVar7,false);
    std::operator<<(poVar5,(string *)&tmpex);
    std::__cxx11::string::~string((string *)&tmpex);
  }
  cleanup_member_name_mapping(this,tstruct_00);
  if (!bVar3) {
    std::operator<<(out,", ");
  }
  poVar5 = std::operator<<(out,"");
  poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,");");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  if (p_Var1 != (_Rb_tree_header *)iVar6._M_node) {
    t_generator::indent_abi_cxx11_(&tmpex,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&tmpex);
    poVar5 = std::operator<<(poVar5,"#pragma warning restore CS0618,CS0612");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&tmpex);
  }
  collect_extensions_types(this,tstruct);
  prepare_member_name_mapping(this,tstruct,&tstruct->members_,&resultname);
  if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar2 = *piVar2 + -1;
    t_generator::indent_abi_cxx11_(&tmpex,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&tmpex);
    poVar5 = std::operator<<(poVar5,"}");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&tmpex);
    for (pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar7 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
      std::__cxx11::string::string((string *)&local_50,"tmp",(allocator *)&tmpvar);
      t_generator::tmp(&tmpex,(t_generator *)this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&tmpvar);
      poVar5 = std::operator<<(poVar5,"catch (");
      type_name_abi_cxx11_(&local_2c0,this,(*pptVar7)->type_,true);
      poVar5 = std::operator<<(poVar5,(string *)&local_2c0);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,(string *)&tmpex);
      poVar5 = std::operator<<(poVar5,")");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_268,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_268);
      poVar5 = std::operator<<(poVar5,"{");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&tmpvar);
      if (tfunction->oneway_ == false) {
        piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar2 = *piVar2 + 1;
        t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
        poVar5 = std::operator<<(out,(string *)&tmpvar);
        poVar5 = std::operator<<(poVar5,(string *)&tmpResult);
        poVar5 = std::operator<<(poVar5,".");
        prop_name_abi_cxx11_(&local_2c0,this,*pptVar7,false);
        poVar5 = std::operator<<(poVar5,(string *)&local_2c0);
        poVar5 = std::operator<<(poVar5," = ");
        poVar5 = std::operator<<(poVar5,(string *)&tmpex);
        poVar5 = std::operator<<(poVar5,";");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&tmpvar);
        piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar2 = *piVar2 + -1;
      }
      t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&tmpvar);
      poVar5 = std::operator<<(poVar5,"}");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&tmpvar);
      std::__cxx11::string::~string((string *)&tmpex);
    }
  }
  if (tfunction->oneway_ == false) {
    t_generator::indent_abi_cxx11_(&tmpex,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&tmpex);
    poVar5 = std::operator<<(poVar5,"await oprot.WriteMessageBeginAsync(new TMessage(\"");
    poVar5 = std::operator<<(poVar5,(string *)__lhs);
    poVar5 = std::operator<<(poVar5,"\", TMessageType.Reply, seqid), ");
    poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"); ");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&tmpvar);
    poVar5 = std::operator<<(poVar5,"await ");
    poVar5 = std::operator<<(poVar5,(string *)&tmpResult);
    poVar5 = std::operator<<(poVar5,".WriteAsync(oprot, ");
    poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,");");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&tmpvar);
    std::__cxx11::string::~string((string *)&tmpex);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  cleanup_member_name_mapping(this,tstruct);
  std::__cxx11::string::string((string *)&local_f0,"tmp",(allocator *)&tmpvar);
  t_generator::tmp(&tmpex,(t_generator *)this,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  t_generator::indent_abi_cxx11_(&tmpvar,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&tmpvar);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_2c0);
  poVar5 = std::operator<<(poVar5,"catch (TTransportException)");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_268,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_268);
  poVar5 = std::operator<<(poVar5,"{");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_248);
  poVar5 = std::operator<<(poVar5,"  throw;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_110);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_130);
  poVar5 = std::operator<<(poVar5,"catch (Exception ");
  poVar5 = std::operator<<(poVar5,(string *)&tmpex);
  poVar5 = std::operator<<(poVar5,")");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_150);
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&tmpvar);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  std::__cxx11::string::string((string *)&local_170,"tmp",(allocator *)&local_2c0);
  t_generator::tmp(&tmpvar,(t_generator *)this,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_2c0);
  poVar5 = std::operator<<(poVar5,"var ");
  poVar5 = std::operator<<(poVar5,(string *)&tmpvar);
  poVar5 = std::operator<<(poVar5," = $\"Error occurred in {GetType().FullName}: {");
  poVar5 = std::operator<<(poVar5,(string *)&tmpex);
  poVar5 = std::operator<<(poVar5,".Message}\";");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2c0);
  t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_2c0);
  poVar5 = std::operator<<(poVar5,"if(_logger != null)");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2c0);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_2c0);
  poVar5 = std::operator<<(poVar5,"_logger.LogError(");
  poVar5 = std::operator<<(poVar5,(string *)&tmpex);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = std::operator<<(poVar5,(string *)&tmpvar);
  poVar5 = std::operator<<(poVar5,");");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2c0);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_2c0);
  poVar5 = std::operator<<(poVar5,"else");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2c0);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_2c0);
  poVar5 = std::operator<<(poVar5,"Console.Error.WriteLine(");
  poVar5 = std::operator<<(poVar5,(string *)&tmpvar);
  poVar5 = std::operator<<(poVar5,");");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2c0);
  iVar4 = (this->super_t_oop_generator).super_t_generator.indent_;
  (this->super_t_oop_generator).super_t_generator.indent_ = iVar4 + -1;
  if (tfunction->oneway_ == true) {
    (this->super_t_oop_generator).super_t_generator.indent_ = iVar4 + -2;
    t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_2c0);
    poVar5 = std::operator<<(poVar5,"}");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  else {
    std::__cxx11::string::string((string *)&local_190,"tmp",(allocator *)&local_268);
    t_generator::tmp(&local_2c0,(t_generator *)this,&local_190);
    std::__cxx11::string::operator=((string *)&tmpvar,(string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_190);
    t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_2c0);
    poVar5 = std::operator<<(poVar5,"var ");
    poVar5 = std::operator<<(poVar5,(string *)&tmpvar);
    poVar5 = std::operator<<(poVar5,
                             " = new TApplicationException(TApplicationException.ExceptionType.InternalError,\" Internal error.\");"
                            );
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_268,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_268);
    poVar5 = std::operator<<(poVar5,"await oprot.WriteMessageBeginAsync(new TMessage(\"");
    poVar5 = std::operator<<(poVar5,(string *)__lhs);
    poVar5 = std::operator<<(poVar5,"\", TMessageType.Exception, seqid), ");
    poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,");");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_248);
    poVar5 = std::operator<<(poVar5,"await ");
    poVar5 = std::operator<<(poVar5,(string *)&tmpvar);
    poVar5 = std::operator<<(poVar5,".WriteAsync(oprot, ");
    poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,");");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2c0);
    piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar2 = *piVar2 + -1;
    t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_2c0);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_268,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_268);
    poVar5 = std::operator<<(poVar5,"await oprot.WriteMessageEndAsync(");
    poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,");");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_248);
    poVar5 = std::operator<<(poVar5,"await oprot.Transport.FlushAsync(");
    poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,");");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
  }
  std::__cxx11::string::~string((string *)&local_2c0);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_2c0);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&tmpvar);
  std::__cxx11::string::~string((string *)&tmpex);
  std::__cxx11::string::~string((string *)&tmpResult);
  std::__cxx11::string::~string((string *)&args);
  std::__cxx11::string::~string((string *)&resultname);
  std::__cxx11::string::~string((string *)&argsname);
  return;
}

Assistant:

void t_netstd_generator::generate_process_function_async(ostream& out, t_service* tservice, t_function* tfunction)
{
    (void)tservice;
    out << indent() << "public async global::System.Threading.Tasks.Task " << tfunction->get_name()
        << "_ProcessAsync(int seqid, TProtocol iprot, TProtocol oprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ")" << endl
        << indent() << "{" << endl;
    indent_up();

    string argsname = tfunction->get_name() + "_args";
    string resultname = tfunction->get_name() + "_result";

    string args = tmp("tmp");
    out << indent() << "var " << args << " = new InternalStructs." << argsname << "();" << endl
        << indent() << "await " << args << ".ReadAsync(iprot, " << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await iprot.ReadMessageEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;

    string tmpResult = tmp("tmp");
    if (!tfunction->is_oneway())
    {
        out << indent() << "var " << tmpResult << " = new InternalStructs." << resultname << "();" << endl;
    }

    out << indent() << "try" << endl
        << indent() << "{" << endl;
    indent_up();

    t_struct* xs = tfunction->get_xceptions();
    const vector<t_field*>& xceptions = xs->get_members();

    if (xceptions.size() > 0)
    {
        out << indent() << "try" << endl
            << indent() << "{" << endl;
        indent_up();
    }

    t_struct* arg_struct = tfunction->get_arglist();
    const vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator f_iter;

    bool is_deprecated = (tfunction->annotations_.end() != tfunction->annotations_.find("deprecated"));
    if( is_deprecated) {
      out << indent() << "#pragma warning disable CS0618,CS0612" << endl;
    }

    out << indent();
    if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void())
    {
        out << tmpResult << ".Success = ";
    }

    out << "await _iAsync." << func_name(normalize_name(tfunction->get_name()) + (add_async_postfix ? "Async" : "")) << "(";

    bool first = true;
    collect_extensions_types(arg_struct);
    prepare_member_name_mapping(arg_struct);
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        if (first)
        {
            first = false;
        }
        else
        {
            out << ", ";
        }

        out << args << "." << prop_name(*f_iter);
    }

    cleanup_member_name_mapping(arg_struct);

    if (!first)
    {
        out << ", ";
    }

    out << "" << CANCELLATION_TOKEN_NAME << ");" << endl;

    if( is_deprecated) {
      out << indent() << "#pragma warning restore CS0618,CS0612" << endl;
    }

    vector<t_field*>::const_iterator x_iter;

    collect_extensions_types(xs);
    prepare_member_name_mapping(xs, xs->get_members(), resultname);
    if (xceptions.size() > 0)
    {
        indent_down();
        out << indent() << "}" << endl;

        for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter)
        {
            string tmpex = tmp("tmp");
            out << indent() << "catch (" << type_name((*x_iter)->get_type()) << " " << tmpex << ")" << endl
                << indent() << "{" << endl;

            if (!tfunction->is_oneway())
            {
                indent_up();
                out << indent() << tmpResult << "." << prop_name(*x_iter) << " = " << tmpex << ";" << endl;
                indent_down();
            }
            out << indent() << "}" << endl;
        }
    }

    if (!tfunction->is_oneway())
    {
        out << indent() << "await oprot.WriteMessageBeginAsync(new TMessage(\""
                << tfunction->get_name() << "\", TMessageType.Reply, seqid), " << CANCELLATION_TOKEN_NAME << "); " << endl
            << indent() << "await " << tmpResult << ".WriteAsync(oprot, " << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    indent_down();

    cleanup_member_name_mapping(xs);

    string tmpex = tmp("tmp");
    out << indent() << "}" << endl
        << indent() << "catch (TTransportException)" << endl
        << indent() << "{" << endl
        << indent() << "  throw;" << endl
        << indent() << "}" << endl
        << indent() << "catch (Exception " << tmpex << ")" << endl
        << indent() << "{" << endl;
    indent_up();

    string tmpvar = tmp("tmp");
    out << indent() << "var " << tmpvar << " = $\"Error occurred in {GetType().FullName}: {" << tmpex << ".Message}\";" << endl;
    out << indent() << "if(_logger != null)" << endl;
    indent_up();
    out << indent() << "_logger.LogError(" << tmpex << ", " << tmpvar << ");" << endl;
    indent_down();
    out << indent() << "else" << endl;
    indent_up();
    out << indent() << "Console.Error.WriteLine(" << tmpvar << ");" << endl;
    indent_down();

    if (tfunction->is_oneway())
    {
        indent_down();
        out << indent() << "}" << endl;
    }
    else
    {
        tmpvar = tmp("tmp");
        out << indent() << "var " << tmpvar << " = new TApplicationException(TApplicationException.ExceptionType.InternalError,\" Internal error.\");" << endl
            << indent() << "await oprot.WriteMessageBeginAsync(new TMessage(\"" << tfunction->get_name()
            << "\", TMessageType.Exception, seqid), " << CANCELLATION_TOKEN_NAME << ");" << endl
            << indent() << "await " << tmpvar << ".WriteAsync(oprot, " << CANCELLATION_TOKEN_NAME << ");" << endl;
        indent_down();

        out << indent() << "}" << endl
            << indent() << "await oprot.WriteMessageEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
            << indent() << "await oprot.Transport.FlushAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }

    indent_down();
    out << indent() << "}" << endl << endl;
}